

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertForCygwin.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ConvertForCygwin::convertProgramForCygwin(ConvertForCygwin *this,string *filePath)

{
  char *in_RDX;
  string *in_RDI;
  string *__lhs;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  __lhs = in_RDI;
  ::std::operator+(in_RDX,in_stack_ffffffffffffffe0);
  ::std::operator+(__lhs,(char *)in_RDI);
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string ConvertForCygwin::convertProgramForCygwin(const std::string& filePath)
    {
        return "$(cygpath '" + filePath + "')";
    }